

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O0

aiNode * __thiscall
Assimp::AC3DImporter::ConvertObjectSection
          (AC3DImporter *this,Object *object,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes,
          vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *outMaterials,
          vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
          *materials,aiNode *parent)

{
  allocator<std::pair<unsigned_int,_unsigned_int>_> *this_00;
  value_type paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *pvVar4;
  float fVar5;
  vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> *pvVar6;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *this_01;
  bool bVar7;
  uint uVar8;
  ai_uint32 aVar9;
  aiNode *paVar10;
  size_type sVar11;
  Logger *pLVar12;
  aiMesh *paVar13;
  reference ppaVar14;
  ulong uVar15;
  ulong *puVar16;
  reference pvVar17;
  void *pvVar18;
  aiMaterial *paVar19;
  const_reference pvVar20;
  reference ppaVar21;
  reference pvVar22;
  reference ppVar23;
  DeadlyImportError *pDVar24;
  aiVector3D *paVar25;
  reference pSVar26;
  uint *puVar27;
  reference ppVar28;
  Subdivider *__p;
  pointer pSVar29;
  reference ppaVar30;
  long lVar31;
  ulong uVar32;
  aiNode **ppaVar33;
  reference object_00;
  aiFace *paVar34;
  uint *puVar35;
  ulong uVar36;
  aiVector3t<float> aVar37;
  aiVector3t<float> *local_570;
  aiVector3t<float> *local_548;
  aiFace *local_500;
  aiVector3t<float> *local_3f8;
  aiFace *local_3d0;
  uint local_394;
  uint i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  aiMesh **local_330;
  __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> local_328;
  aiMesh **local_320;
  __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> local_318;
  __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> local_310;
  allocator<aiMesh_*> local_301;
  value_type local_300;
  undefined1 local_2f8 [8];
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> cpy;
  unique_ptr<Assimp::Subdivider,_std::default_delete<Assimp::Subdivider>_> local_2c0;
  unique_ptr<Assimp::Subdivider,_std::default_delete<Assimp::Subdivider>_> div;
  allocator<char> local_2a9;
  string local_2a8;
  __normal_iterator<std::pair<unsigned_int,_aiVector2t<float>_>_*,_std::vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>_>
  local_288;
  aiFace *local_280;
  aiFace *face_1;
  uint m;
  uint tmp;
  undefined8 local_268;
  float local_260;
  undefined8 local_258;
  float local_250;
  undefined1 local_24a;
  allocator<char> local_249;
  string local_248;
  const_reference local_228;
  SurfaceEntry *entry;
  aiFace *paStack_218;
  uint i_1;
  aiFace *face;
  reference pSStack_208;
  uint type;
  Surface *src;
  aiVector3D *local_1f8;
  aiVector3D *uv;
  aiVector3D *paStack_1e8;
  uint cur;
  aiVector3D *vertices;
  string local_1d8;
  undefined1 local_1b2;
  allocator<char> local_1b1;
  string local_1b0;
  aiFace *local_190;
  aiFace *faces_1;
  string local_180;
  undefined1 local_15a;
  allocator<char> local_159;
  string local_158;
  aiMaterial *local_138;
  aiMesh *local_130;
  aiMesh *mesh_1;
  __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_120;
  const_iterator cend;
  __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_110;
  const_iterator cit;
  size_t oldm;
  uint *puStack_f8;
  uint mat;
  uint *pip;
  uint local_dc;
  uint idx;
  __normal_iterator<std::pair<unsigned_int,_aiVector2t<float>_>_*,_std::vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>_>
  local_d0;
  iterator end2;
  iterator it2;
  iterator end;
  iterator it;
  int local_a8 [2];
  pair<unsigned_int,_unsigned_int> local_a0;
  undefined1 local_98 [8];
  MatTable needMat;
  uint local_74;
  aiVector3D *paStack_70;
  uint i;
  aiVector3D *verts;
  aiFace *faces;
  aiMesh *mesh;
  aiNode *local_40;
  aiNode *node;
  aiNode *parent_local;
  vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
  *materials_local;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *outMaterials_local;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes_local;
  Object *object_local;
  AC3DImporter *this_local;
  
  node = parent;
  parent_local = (aiNode *)materials;
  materials_local =
       (vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> *)
       outMaterials;
  outMaterials_local = (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)meshes;
  meshes_local = (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)object;
  object_local = (Object *)this;
  paVar10 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar10);
  paVar10->mParent = node;
  local_40 = paVar10;
  sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                      &meshes_local[6].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar11 != 0) {
    sVar11 = std::
             vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>::
             size((vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                   *)&meshes_local[7].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((sVar11 == 0) ||
       (*(int *)&meshes_local[8].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage == 0)) {
      pLVar12 = DefaultLogger::get();
      Logger::info(pLVar12,
                   "AC3D: No surfaces defined in object definition, a point list is returned");
      this_01 = outMaterials_local;
      paVar13 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar13);
      mesh = paVar13;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)this_01,&mesh);
      ppaVar14 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::back
                           ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)outMaterials_local);
      paVar1 = *ppaVar14;
      sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          &meshes_local[6].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      paVar1->mNumVertices = (uint)sVar11;
      paVar1->mNumFaces = (uint)sVar11;
      uVar32 = CONCAT44(0,paVar1->mNumFaces);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar32;
      uVar15 = SUB168(auVar2 * ZEXT816(0x10),0);
      uVar36 = uVar15 + 8;
      if (SUB168(auVar2 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar15) {
        uVar36 = 0xffffffffffffffff;
      }
      puVar16 = (ulong *)operator_new__(uVar36);
      *puVar16 = uVar32;
      verts = (aiVector3D *)(puVar16 + 1);
      if (uVar32 != 0) {
        local_3d0 = (aiFace *)verts;
        do {
          aiFace::aiFace(local_3d0);
          local_3d0 = local_3d0 + 1;
        } while (local_3d0 != (aiFace *)((long)verts + uVar32 * 0x10));
      }
      paVar1->mFaces = (aiFace *)verts;
      uVar32 = CONCAT44(0,paVar1->mNumVertices);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar32;
      uVar15 = SUB168(auVar3 * ZEXT816(0xc),0);
      if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
        uVar15 = 0xffffffffffffffff;
      }
      paStack_70 = (aiVector3D *)operator_new__(uVar15);
      if (uVar32 != 0) {
        local_3f8 = paStack_70;
        do {
          aiVector3t<float>::aiVector3t(local_3f8);
          local_3f8 = local_3f8 + 1;
        } while (local_3f8 != paStack_70 + uVar32);
      }
      paVar1->mVertices = paStack_70;
      for (local_74 = 0; pvVar6 = materials_local, local_74 < paVar1->mNumVertices;
          local_74 = local_74 + 1) {
        pvVar17 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             &meshes_local[6].
                              super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,(ulong)local_74);
        fVar5 = pvVar17->y;
        paStack_70->x = pvVar17->x;
        paStack_70->y = fVar5;
        paStack_70->z = pvVar17->z;
        verts->x = 1.4013e-45;
        pvVar18 = operator_new__(4);
        *(void **)&verts->z = pvVar18;
        **(uint **)&verts->z = local_74;
        verts = (aiVector3D *)&verts[1].y;
        paStack_70 = paStack_70 + 1;
      }
      paVar1->mMaterialIndex = 0;
      paVar19 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(paVar19);
      needMat.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar19;
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
                ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)pvVar6,
                 (value_type *)
                 &needMat.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar4 = meshes_local;
      pvVar20 = std::
                vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                ::operator[]((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                              *)parent_local,0);
      ppaVar21 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::back
                           ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)materials_local);
      ConvertMaterial(this,(Object *)pvVar4,pvVar20,*ppaVar21);
    }
    else {
      sVar11 = std::
               vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
               ::size((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                       *)parent_local);
      local_a8[1] = 0;
      local_a8[0] = 0;
      std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_a0,local_a8 + 1,local_a8);
      this_00 = (allocator<std::pair<unsigned_int,_unsigned_int>_> *)((long)&it._M_current + 7);
      std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(this_00);
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)local_98,sVar11,&local_a0,this_00);
      std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator
                ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)((long)&it._M_current + 7));
      __gnu_cxx::
      __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
      ::__normal_iterator(&end);
      it2._M_current =
           (pair<unsigned_int,_aiVector2t<float>_> *)
           std::
           vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>::
           end((vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                *)&meshes_local[7].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_int,_aiVector2t<float>_>_*,_std::vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>_>
      ::__normal_iterator(&end2);
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_int,_aiVector2t<float>_>_*,_std::vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>_>
      ::__normal_iterator(&local_d0);
      end = std::
            vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>::
            begin((vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                   *)&meshes_local[7].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      while (bVar7 = __gnu_cxx::operator!=
                               (&end,(__normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                                      *)&it2), bVar7) {
        pSVar26 = __gnu_cxx::
                  __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                  ::operator*(&end);
        local_dc = pSVar26->mat;
        sVar11 = std::
                 vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ::size((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)local_98);
        if (sVar11 <= local_dc) {
          pLVar12 = DefaultLogger::get();
          Logger::error(pLVar12,"AC3D: material index is out of range");
          local_dc = 0;
        }
        pSVar26 = __gnu_cxx::
                  __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                  ::operator*(&end);
        bVar7 = std::
                vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                ::empty(&pSVar26->entries);
        if (bVar7) {
          pLVar12 = DefaultLogger::get();
          Logger::warn(pLVar12,"AC3D: surface her zero vertex references");
        }
        pSVar26 = __gnu_cxx::
                  __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                  ::operator*(&end);
        end2 = std::
               vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
               ::begin(&pSVar26->entries);
        pSVar26 = __gnu_cxx::
                  __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                  ::operator*(&end);
        local_d0._M_current =
             (pair<unsigned_int,_aiVector2t<float>_> *)
             std::
             vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
             ::end(&pSVar26->entries);
        while (bVar7 = __gnu_cxx::operator!=(&end2,&local_d0), bVar7) {
          ppVar28 = __gnu_cxx::
                    __normal_iterator<std::pair<unsigned_int,_aiVector2t<float>_>_*,_std::vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>_>
                    ::operator*(&end2);
          uVar8 = ppVar28->first;
          sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                             ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              &meshes_local[6].
                               super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
          if (sVar11 <= uVar8) {
            pLVar12 = DefaultLogger::get();
            Logger::warn(pLVar12,"AC3D: Invalid vertex reference");
            ppVar28 = __gnu_cxx::
                      __normal_iterator<std::pair<unsigned_int,_aiVector2t<float>_>_*,_std::vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>_>
                      ::operator*(&end2);
            ppVar28->first = 0;
          }
          __gnu_cxx::
          __normal_iterator<std::pair<unsigned_int,_aiVector2t<float>_>_*,_std::vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>_>
          ::operator++(&end2);
        }
        pvVar22 = std::
                  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                *)local_98,(ulong)local_dc);
        if (pvVar22->first == 0) {
          local_40->mNumMeshes = local_40->mNumMeshes + 1;
        }
        pSVar26 = __gnu_cxx::
                  __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                  ::operator*(&end);
        uVar8 = pSVar26->flags & 0xf;
        if (uVar8 == 1) {
          pSVar26 = __gnu_cxx::
                    __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                    ::operator*(&end);
          sVar11 = std::
                   vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                   ::size(&pSVar26->entries);
          pvVar22 = std::
                    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  *)local_98,(ulong)local_dc);
          pvVar22->first = (int)sVar11 + pvVar22->first;
          pSVar26 = __gnu_cxx::
                    __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                    ::operator*(&end);
          sVar11 = std::
                   vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                   ::size(&pSVar26->entries);
          pvVar22 = std::
                    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  *)local_98,(ulong)local_dc);
          pvVar22->second = (int)sVar11 * 2 + pvVar22->second;
        }
        else if (uVar8 == 2) {
          pSVar26 = __gnu_cxx::
                    __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                    ::operator*(&end);
          sVar11 = std::
                   vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                   ::size(&pSVar26->entries);
          pvVar22 = std::
                    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  *)local_98,(ulong)local_dc);
          pvVar22->first = (int)sVar11 + -1 + pvVar22->first;
          pSVar26 = __gnu_cxx::
                    __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                    ::operator*(&end);
          sVar11 = std::
                   vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                   ::size(&pSVar26->entries);
          pvVar22 = std::
                    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  *)local_98,(ulong)local_dc);
          pvVar22->second = ((int)sVar11 + -1) * 2 + pvVar22->second;
        }
        else {
          pSVar26 = __gnu_cxx::
                    __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                    ::operator*(&end);
          if ((pSVar26->flags & 0xf) != 0) {
            pLVar12 = DefaultLogger::get();
            Logger::warn(pLVar12,"AC3D: The type flag of a surface is unknown");
            pSVar26 = __gnu_cxx::
                      __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                      ::operator*(&end);
            pSVar26->flags = pSVar26->flags & 0xfffffff0;
          }
          pvVar22 = std::
                    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  *)local_98,(ulong)local_dc);
          pvVar22->first = pvVar22->first + 1;
          pSVar26 = __gnu_cxx::
                    __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                    ::operator*(&end);
          sVar11 = std::
                   vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                   ::size(&pSVar26->entries);
          pvVar22 = std::
                    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  *)local_98,(ulong)local_dc);
          pvVar22->second = (int)sVar11 + pvVar22->second;
        }
        __gnu_cxx::
        __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
        ::operator++(&end);
      }
      puStack_f8 = (uint *)operator_new__((ulong)local_40->mNumMeshes << 2);
      local_40->mMeshes = puStack_f8;
      oldm._4_4_ = 0;
      cit._M_current =
           (pair<unsigned_int,_unsigned_int> *)
           std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                     ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)outMaterials_local);
      cend._M_current =
           (pair<unsigned_int,_unsigned_int> *)
           std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::begin((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)local_98);
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_int,unsigned_int>const*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
      ::__normal_iterator<std::pair<unsigned_int,unsigned_int>*>
                ((__normal_iterator<std::pair<unsigned_int,unsigned_int>const*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
                  *)&local_110,
                 (__normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                  *)&cend);
      mesh_1 = (aiMesh *)
               std::
               vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ::end((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      *)local_98);
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_int,unsigned_int>const*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
      ::__normal_iterator<std::pair<unsigned_int,unsigned_int>*>
                ((__normal_iterator<std::pair<unsigned_int,unsigned_int>const*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
                  *)&local_120,
                 (__normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                  *)&mesh_1);
      while (bVar7 = __gnu_cxx::operator!=(&local_110,&local_120), bVar7) {
        ppVar23 = __gnu_cxx::
                  __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                  ::operator*(&local_110);
        if (ppVar23->first != 0) {
          sVar11 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                             ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)outMaterials_local);
          puVar35 = puStack_f8 + 1;
          *puStack_f8 = (uint)sVar11;
          paVar13 = (aiMesh *)operator_new(0x520);
          aiMesh::aiMesh(paVar13);
          local_130 = paVar13;
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                    ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)outMaterials_local,&local_130);
          sVar11 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                             ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)materials_local
                             );
          pvVar6 = materials_local;
          local_130->mMaterialIndex = (uint)sVar11;
          paVar19 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(paVar19);
          local_138 = paVar19;
          std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
                    ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)pvVar6,&local_138);
          pvVar4 = meshes_local;
          pvVar20 = std::
                    vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                    ::operator[]((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                                  *)parent_local,(ulong)oldm._4_4_);
          ppaVar21 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::back
                               ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                                materials_local);
          ConvertMaterial(this,(Object *)pvVar4,pvVar20,*ppaVar21);
          ppVar23 = __gnu_cxx::
                    __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                    ::operator*(&local_110);
          local_130->mNumFaces = ppVar23->first;
          if (local_130->mNumFaces == 0) {
            local_15a = 1;
            pDVar24 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_158,"AC3D: No faces",&local_159);
            DeadlyImportError::DeadlyImportError(pDVar24,&local_158);
            local_15a = 0;
            __cxa_throw(pDVar24,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          if (0x1000000 < local_130->mNumFaces) {
            faces_1._6_1_ = 1;
            pDVar24 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_180,"AC3D: Too many faces, would run out of memory",
                       (allocator<char> *)((long)&faces_1 + 7));
            DeadlyImportError::DeadlyImportError(pDVar24,&local_180);
            faces_1._6_1_ = 0;
            __cxa_throw(pDVar24,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          uVar32 = (ulong)local_130->mNumFaces;
          puVar16 = (ulong *)operator_new__(uVar32 << 4 | 8);
          *puVar16 = uVar32;
          paVar34 = (aiFace *)(puVar16 + 1);
          if (uVar32 != 0) {
            local_500 = paVar34;
            do {
              aiFace::aiFace(local_500);
              local_500 = local_500 + 1;
            } while (local_500 != paVar34 + uVar32);
          }
          local_130->mFaces = paVar34;
          local_190 = paVar34;
          ppVar23 = __gnu_cxx::
                    __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                    ::operator*(&local_110);
          local_130->mNumVertices = ppVar23->second;
          if (local_130->mNumVertices == 0) {
            local_1b2 = 1;
            pDVar24 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1b0,"AC3D: No vertices",&local_1b1);
            DeadlyImportError::DeadlyImportError(pDVar24,&local_1b0);
            local_1b2 = 0;
            __cxa_throw(pDVar24,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          if (0x1555555 < local_130->mNumVertices) {
            vertices._6_1_ = 1;
            pDVar24 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d8,"AC3D: Too many vertices, would run out of memory",
                       (allocator<char> *)((long)&vertices + 7));
            DeadlyImportError::DeadlyImportError(pDVar24,&local_1d8);
            vertices._6_1_ = 0;
            __cxa_throw(pDVar24,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          uVar32 = (ulong)local_130->mNumVertices;
          paVar25 = (aiVector3D *)operator_new__(uVar32 * 0xc);
          if (uVar32 != 0) {
            local_548 = paVar25;
            do {
              aiVector3t<float>::aiVector3t(local_548);
              local_548 = local_548 + 1;
            } while (local_548 != paVar25 + uVar32);
          }
          local_130->mVertices = paVar25;
          uv._4_4_ = 0;
          local_1f8 = (aiVector3D *)0x0;
          paStack_1e8 = paVar25;
          lVar31 = std::__cxx11::string::length();
          if (lVar31 != 0) {
            uVar32 = (ulong)local_130->mNumVertices;
            paVar25 = (aiVector3D *)operator_new__(uVar32 * 0xc);
            if (uVar32 != 0) {
              local_570 = paVar25;
              do {
                aiVector3t<float>::aiVector3t(local_570);
                local_570 = local_570 + 1;
              } while (local_570 != paVar25 + uVar32);
            }
            local_130->mTextureCoords[0] = paVar25;
            local_130->mNumUVComponents[0] = 2;
            local_1f8 = paVar25;
          }
          src = (Surface *)
                std::
                vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                ::begin((vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                         *)&meshes_local[7].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
          end = (iterator)src;
          while (bVar7 = __gnu_cxx::operator!=
                                   (&end,(__normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                                          *)&it2), puStack_f8 = puVar35, bVar7) {
            pSVar26 = __gnu_cxx::
                      __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                      ::operator*(&end);
            if (oldm._4_4_ == pSVar26->mat) {
              pSStack_208 = __gnu_cxx::
                            __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                            ::operator*(&end);
              pSVar26 = __gnu_cxx::
                        __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                        ::operator*(&end);
              face._4_4_ = pSVar26->flags & 0xf;
              if (face._4_4_ == 0) {
                paStack_218 = local_190;
                local_190 = local_190 + 1;
                sVar11 = std::
                         vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                         ::size(&pSStack_208->entries);
                paStack_218->mNumIndices = (uint)sVar11;
                if ((uint)sVar11 != 0) {
                  puVar27 = (uint *)operator_new__((ulong)paStack_218->mNumIndices << 2);
                  paStack_218->mIndices = puVar27;
                  for (entry._4_4_ = 0; entry._4_4_ < paStack_218->mNumIndices;
                      entry._4_4_ = entry._4_4_ + 1) {
                    local_228 = std::
                                vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                ::operator[](&pSStack_208->entries,(ulong)entry._4_4_);
                    paStack_218->mIndices[entry._4_4_] = uv._4_4_;
                    if (local_130->mNumVertices <=
                        (uint)(((long)paStack_1e8 - (long)local_130->mVertices) / 0xc)) {
                      local_24a = 1;
                      uv._4_4_ = uv._4_4_ + 1;
                      pDVar24 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_248,"AC3D: Invalid number of vertices",&local_249)
                      ;
                      DeadlyImportError::DeadlyImportError(pDVar24,&local_248);
                      local_24a = 0;
                      __cxa_throw(pDVar24,&DeadlyImportError::typeinfo,
                                  DeadlyImportError::~DeadlyImportError);
                    }
                    uv._4_4_ = uv._4_4_ + 1;
                    pvVar17 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                              operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          *)&meshes_local[6].
                                             super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (ulong)local_228->first);
                    aVar37 = ::operator+(pvVar17,(aiVector3t<float> *)
                                                 ((long)&meshes_local[6].
                                                                                                                  
                                                  super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4));
                    local_260 = aVar37.z;
                    local_268 = aVar37._0_8_;
                    paStack_1e8->x = (float)(int)local_268;
                    paStack_1e8->y = (float)(int)((ulong)local_268 >> 0x20);
                    paStack_1e8->z = local_260;
                    if (local_1f8 != (aiVector3D *)0x0) {
                      local_1f8->x = (local_228->second).x;
                      local_1f8->y = (local_228->second).y;
                      local_1f8 = local_1f8 + 1;
                    }
                    paStack_1e8 = paStack_1e8 + 1;
                    local_258 = local_268;
                    local_250 = local_260;
                  }
                }
              }
              else {
                pSVar26 = __gnu_cxx::
                          __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                          ::operator*(&end);
                _m = std::
                     vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                     ::begin(&pSVar26->entries);
                end2._M_current = _m;
                pSVar26 = __gnu_cxx::
                          __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                          ::operator*(&end);
                sVar11 = std::
                         vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                         ::size(&pSVar26->entries);
                face_1._4_4_ = (uint)sVar11;
                if (face._4_4_ == 2) {
                  face_1._4_4_ = face_1._4_4_ - 1;
                }
                for (face_1._0_4_ = 0; (uint)face_1 < face_1._4_4_; face_1._0_4_ = (uint)face_1 + 1)
                {
                  local_280 = local_190;
                  local_190->mNumIndices = 2;
                  local_190 = local_190 + 1;
                  puVar27 = (uint *)operator_new__(8);
                  local_280->mIndices = puVar27;
                  uVar8 = uv._4_4_ + 1;
                  *local_280->mIndices = uv._4_4_;
                  uv._4_4_ = uv._4_4_ + 2;
                  local_280->mIndices[1] = uVar8;
                  pSVar26 = __gnu_cxx::
                            __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                            ::operator*(&end);
                  local_288._M_current =
                       (pair<unsigned_int,_aiVector2t<float>_> *)
                       std::
                       vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                       ::end(&pSVar26->entries);
                  bVar7 = __gnu_cxx::operator==(&end2,&local_288);
                  if (bVar7) {
                    pDVar24 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_2a8,"AC3D: Bad line",&local_2a9);
                    DeadlyImportError::DeadlyImportError(pDVar24,&local_2a8);
                    __cxa_throw(pDVar24,&DeadlyImportError::typeinfo,
                                DeadlyImportError::~DeadlyImportError);
                  }
                  ppVar28 = __gnu_cxx::
                            __normal_iterator<std::pair<unsigned_int,_aiVector2t<float>_>_*,_std::vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>_>
                            ::operator*(&end2);
                  uVar8 = ppVar28->first;
                  sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       *)&meshes_local[6].
                                          super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
                  if (sVar11 <= uVar8) {
                    __assert_fail("(*it2).first < object.vertices.size()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/AC/ACLoader.cpp"
                                  ,0x2a3,
                                  "aiNode *Assimp::AC3DImporter::ConvertObjectSection(Object &, std::vector<aiMesh *> &, std::vector<aiMaterial *> &, const std::vector<Material> &, aiNode *)"
                                 );
                  }
                  pvVar4 = meshes_local + 6;
                  ppVar28 = __gnu_cxx::
                            __normal_iterator<std::pair<unsigned_int,_aiVector2t<float>_>_*,_std::vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>_>
                            ::operator*(&end2);
                  pvVar17 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                            operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        *)&(pvVar4->
                                           super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (ulong)ppVar28->first);
                  paVar25 = paStack_1e8 + 1;
                  fVar5 = pvVar17->y;
                  paStack_1e8->x = pvVar17->x;
                  paStack_1e8->y = fVar5;
                  paStack_1e8->z = pvVar17->z;
                  paStack_1e8 = paVar25;
                  if (local_1f8 != (aiVector3D *)0x0) {
                    ppVar28 = __gnu_cxx::
                              __normal_iterator<std::pair<unsigned_int,_aiVector2t<float>_>_*,_std::vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>_>
                              ::operator*(&end2);
                    local_1f8->x = (ppVar28->second).x;
                    ppVar28 = __gnu_cxx::
                              __normal_iterator<std::pair<unsigned_int,_aiVector2t<float>_>_*,_std::vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>_>
                              ::operator*(&end2);
                    local_1f8->y = (ppVar28->second).y;
                    local_1f8 = local_1f8 + 1;
                  }
                  if ((face._4_4_ == 1) && (face_1._4_4_ - 1 == (uint)face_1)) {
                    pSVar26 = __gnu_cxx::
                              __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
                              ::operator*(&end);
                    div._M_t.
                    super___uniq_ptr_impl<Assimp::Subdivider,_std::default_delete<Assimp::Subdivider>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Assimp::Subdivider_*,_std::default_delete<Assimp::Subdivider>_>
                    .super__Head_base<0UL,_Assimp::Subdivider_*,_false>._M_head_impl =
                         (__uniq_ptr_data<Assimp::Subdivider,_std::default_delete<Assimp::Subdivider>,_true,_true>
                          )std::
                           vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                           ::begin(&pSVar26->entries);
                    end2 = (iterator)
                           div._M_t.
                           super___uniq_ptr_impl<Assimp::Subdivider,_std::default_delete<Assimp::Subdivider>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Assimp::Subdivider_*,_std::default_delete<Assimp::Subdivider>_>
                           .super__Head_base<0UL,_Assimp::Subdivider_*,_false>._M_head_impl;
                  }
                  else {
                    __gnu_cxx::
                    __normal_iterator<std::pair<unsigned_int,_aiVector2t<float>_>_*,_std::vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>_>
                    ::operator++(&end2);
                  }
                  pvVar4 = meshes_local + 6;
                  ppVar28 = __gnu_cxx::
                            __normal_iterator<std::pair<unsigned_int,_aiVector2t<float>_>_*,_std::vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>_>
                            ::operator*(&end2);
                  pvVar17 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                            operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        *)&(pvVar4->
                                           super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (ulong)ppVar28->first);
                  paVar25 = paStack_1e8 + 1;
                  fVar5 = pvVar17->y;
                  paStack_1e8->x = pvVar17->x;
                  paStack_1e8->y = fVar5;
                  paStack_1e8->z = pvVar17->z;
                  paStack_1e8 = paVar25;
                  if (local_1f8 != (aiVector3D *)0x0) {
                    ppVar28 = __gnu_cxx::
                              __normal_iterator<std::pair<unsigned_int,_aiVector2t<float>_>_*,_std::vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>_>
                              ::operator*(&end2);
                    local_1f8->x = (ppVar28->second).x;
                    ppVar28 = __gnu_cxx::
                              __normal_iterator<std::pair<unsigned_int,_aiVector2t<float>_>_*,_std::vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>_>
                              ::operator*(&end2);
                    local_1f8->y = (ppVar28->second).y;
                    local_1f8 = local_1f8 + 1;
                  }
                }
              }
            }
            __gnu_cxx::
            __normal_iterator<Assimp::AC3DImporter::Surface_*,_std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>_>
            ::operator++(&end);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
        ::operator++(&local_110);
        oldm._4_4_ = oldm._4_4_ + 1;
      }
      if (*(int *)((long)&meshes_local[8].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 4) != 0) {
        if ((this->configEvalSubdivision & 1U) == 0) {
          pLVar12 = DefaultLogger::get();
          std::operator+(&local_350,
                         "AC3D: Letting the subdivision surface untouched due to my configuration: "
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &(meshes_local->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                           _M_impl.super__Vector_impl_data._M_finish);
          Logger::info(pLVar12,&local_350);
          std::__cxx11::string::~string((string *)&local_350);
        }
        else {
          __p = Subdivider::Create(CATMULL_CLARKE);
          std::unique_ptr<Assimp::Subdivider,std::default_delete<Assimp::Subdivider>>::
          unique_ptr<std::default_delete<Assimp::Subdivider>,void>
                    ((unique_ptr<Assimp::Subdivider,std::default_delete<Assimp::Subdivider>> *)
                     &local_2c0,__p);
          pLVar12 = DefaultLogger::get();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         "AC3D: Evaluating subdivision surface: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &(meshes_local->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish);
          Logger::info(pLVar12,(string *)
                               &cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string
                    ((string *)
                     &cpy.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          sVar11 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                             ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)outMaterials_local);
          sVar11 = sVar11 - (long)cit._M_current;
          local_300 = (value_type)0x0;
          std::allocator<aiMesh_*>::allocator(&local_301);
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
                    ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_2f8,sVar11,&local_300,
                     &local_301);
          std::allocator<aiMesh_*>::~allocator(&local_301);
          pSVar29 = std::unique_ptr<Assimp::Subdivider,_std::default_delete<Assimp::Subdivider>_>::
                    operator->(&local_2c0);
          ppaVar14 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                               ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)outMaterials_local,
                                (size_type)cit._M_current);
          sVar11 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                             ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_2f8);
          ppaVar30 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::front
                               ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_2f8);
          (*pSVar29->_vptr_Subdivider[3])
                    (pSVar29,ppaVar14,sVar11,ppaVar30,
                     (ulong)*(uint *)((long)&meshes_local[8].
                                             super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                     ,1);
          local_310._M_current =
               (aiMesh **)
               std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin
                         ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_2f8);
          local_318._M_current =
               (aiMesh **)
               std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end
                         ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_2f8);
          local_328._M_current =
               (aiMesh **)
               std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin
                         ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)outMaterials_local);
          local_320 = (aiMesh **)
                      __gnu_cxx::
                      __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                      ::operator+(&local_328,(difference_type)cit._M_current);
          local_330 = (aiMesh **)
                      std::
                      copy<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>>
                                (local_310,local_318,
                                 (__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                  )local_320);
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
                    ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_2f8);
          std::unique_ptr<Assimp::Subdivider,_std::default_delete<Assimp::Subdivider>_>::~unique_ptr
                    (&local_2c0);
        }
      }
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *)local_98);
    }
  }
  lVar31 = std::__cxx11::string::length();
  if (lVar31 == 0) {
    switch(*(undefined4 *)
            &(meshes_local->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
             super__Vector_impl_data._M_start) {
    case 0:
      this->worlds = this->worlds + 1;
      aVar9 = snprintf((local_40->mName).data,0x400,"ACWorld_%i");
      (local_40->mName).length = aVar9;
      break;
    case 1:
      this->polys = this->polys + 1;
      aVar9 = snprintf((local_40->mName).data,0x400,"ACPoly_%i");
      (local_40->mName).length = aVar9;
      break;
    case 2:
      this->groups = this->groups + 1;
      aVar9 = snprintf((local_40->mName).data,0x400,"ACGroup_%i");
      (local_40->mName).length = aVar9;
      break;
    case 4:
      this->lights = this->lights + 1;
      aVar9 = snprintf((local_40->mName).data,0x400,"ACLight_%i");
      (local_40->mName).length = aVar9;
    }
  }
  else {
    aiString::Set(&local_40->mName,
                  (string *)
                  &(meshes_local->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish);
  }
  aiMatrix4x4t<float>::aiMatrix4x4t
            ((aiMatrix4x4t<float> *)&stack0xfffffffffffffc70,
             (aiMatrix3x3t<float> *)
             &meshes_local[4].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  memcpy(&local_40->mTransformation,&stack0xfffffffffffffc70,0x40);
  if ((*(int *)&(meshes_local->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                super__Vector_impl_data._M_start == 2) ||
     (*(int *)&meshes_local[8].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage == 0)) {
    (local_40->mTransformation).a4 =
         *(float *)((long)&meshes_local[6].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                           _M_impl.super__Vector_impl_data._M_start + 4);
    (local_40->mTransformation).b4 =
         *(float *)&meshes_local[6].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
    (local_40->mTransformation).c4 =
         *(float *)((long)&meshes_local[6].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish + 4);
  }
  sVar11 = std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
           ::size((vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                   *)&meshes_local[1].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar11 != 0) {
    sVar11 = std::
             vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::
             size((vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                   *)&meshes_local[1].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_40->mNumChildren = (uint)sVar11;
    auVar2 = ZEXT416(local_40->mNumChildren) * ZEXT816(8);
    uVar32 = auVar2._0_8_;
    if (auVar2._8_8_ != 0) {
      uVar32 = 0xffffffffffffffff;
    }
    ppaVar33 = (aiNode **)operator_new__(uVar32);
    local_40->mChildren = ppaVar33;
    for (local_394 = 0; local_394 < local_40->mNumChildren; local_394 = local_394 + 1) {
      object_00 = std::
                  vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                  ::operator[]((vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                                *)&meshes_local[1].
                                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,(ulong)local_394);
      paVar10 = ConvertObjectSection
                          (this,object_00,
                           (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)outMaterials_local,
                           (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)materials_local,
                           (vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                            *)parent_local,local_40);
      local_40->mChildren[local_394] = paVar10;
    }
  }
  return local_40;
}

Assistant:

aiNode* AC3DImporter::ConvertObjectSection(Object& object,
    std::vector<aiMesh*>& meshes,
    std::vector<aiMaterial*>& outMaterials,
    const std::vector<Material>& materials,
    aiNode* parent)
{
    aiNode* node = new aiNode();
    node->mParent = parent;
    if (object.vertices.size())
    {
        if (!object.surfaces.size() || !object.numRefs)
        {
            /* " An object with 7 vertices (no surfaces, no materials defined).
                 This is a good way of getting point data into AC3D.
                 The Vertex->create convex-surface/object can be used on these
                 vertices to 'wrap' a 3d shape around them "
                 (http://www.opencity.info/html/ac3dfileformat.html)

                 therefore: if no surfaces are defined return point data only
             */

            ASSIMP_LOG_INFO("AC3D: No surfaces defined in object definition, "
                "a point list is returned");

            meshes.push_back(new aiMesh());
            aiMesh* mesh = meshes.back();

            mesh->mNumFaces = mesh->mNumVertices = (unsigned int)object.vertices.size();
            aiFace* faces = mesh->mFaces = new aiFace[mesh->mNumFaces];
            aiVector3D* verts = mesh->mVertices = new aiVector3D[mesh->mNumVertices];

            for (unsigned int i = 0; i < mesh->mNumVertices;++i,++faces,++verts)
            {
                *verts = object.vertices[i];
                faces->mNumIndices = 1;
                faces->mIndices = new unsigned int[1];
                faces->mIndices[0] = i;
            }

            // use the primary material in this case. this should be the
            // default material if all objects of the file contain points
            // and no faces.
            mesh->mMaterialIndex = 0;
            outMaterials.push_back(new aiMaterial());
            ConvertMaterial(object, materials[0], *outMaterials.back());
        }
        else
        {
            // need to generate one or more meshes for this object.
            // find out how many different materials we have
            typedef std::pair< unsigned int, unsigned int > IntPair;
            typedef std::vector< IntPair > MatTable;
            MatTable needMat(materials.size(),IntPair(0,0));

            std::vector<Surface>::iterator it,end = object.surfaces.end();
            std::vector<Surface::SurfaceEntry>::iterator it2,end2;

            for (it = object.surfaces.begin(); it != end; ++it)
            {
                unsigned int idx = (*it).mat;
                if (idx >= needMat.size())
                {
                    ASSIMP_LOG_ERROR("AC3D: material index is out of range");
                    idx = 0;
                }
                if ((*it).entries.empty())
                {
                    ASSIMP_LOG_WARN("AC3D: surface her zero vertex references");
                }

                // validate all vertex indices to make sure we won't crash here
                for (it2  = (*it).entries.begin(),
                     end2 = (*it).entries.end(); it2 != end2; ++it2)
                {
                    if ((*it2).first >= object.vertices.size())
                    {
                        ASSIMP_LOG_WARN("AC3D: Invalid vertex reference");
                        (*it2).first = 0;
                    }
                }

                if (!needMat[idx].first)++node->mNumMeshes;

                switch ((*it).flags & 0xf)
                {
                    // closed line
                case 0x1:

                    needMat[idx].first  += (unsigned int)(*it).entries.size();
                    needMat[idx].second += (unsigned int)(*it).entries.size()<<1u;
                    break;

                    // unclosed line
                case 0x2:

                    needMat[idx].first  += (unsigned int)(*it).entries.size()-1;
                    needMat[idx].second += ((unsigned int)(*it).entries.size()-1)<<1u;
                    break;

                    // 0 == polygon, else unknown
                default:

                    if ((*it).flags & 0xf)
                    {
                        ASSIMP_LOG_WARN("AC3D: The type flag of a surface is unknown");
                        (*it).flags &= ~(0xf);
                    }

                    // the number of faces increments by one, the number
                    // of vertices by surface.numref.
                    needMat[idx].first++;
                    needMat[idx].second += (unsigned int)(*it).entries.size();
                };
            }
            unsigned int* pip = node->mMeshes = new unsigned int[node->mNumMeshes];
            unsigned int mat = 0;
            const size_t oldm = meshes.size();
            for (MatTable::const_iterator cit = needMat.begin(), cend = needMat.end();
                cit != cend; ++cit, ++mat)
            {
                if (!(*cit).first)continue;

                // allocate a new aiMesh object
                *pip++ = (unsigned int)meshes.size();
                aiMesh* mesh = new aiMesh();
                meshes.push_back(mesh);

                mesh->mMaterialIndex = (unsigned int)outMaterials.size();
                outMaterials.push_back(new aiMaterial());
                ConvertMaterial(object, materials[mat], *outMaterials.back());

                // allocate storage for vertices and normals
                mesh->mNumFaces = (*cit).first;
                if (mesh->mNumFaces == 0) {
                    throw DeadlyImportError("AC3D: No faces");
                } else if (mesh->mNumFaces > AI_MAX_ALLOC(aiFace)) {
                    throw DeadlyImportError("AC3D: Too many faces, would run out of memory");
                }
                aiFace* faces = mesh->mFaces = new aiFace[mesh->mNumFaces];

                mesh->mNumVertices = (*cit).second;
                if (mesh->mNumVertices == 0) {
                    throw DeadlyImportError("AC3D: No vertices");
                } else if (mesh->mNumVertices > AI_MAX_ALLOC(aiVector3D)) {
                    throw DeadlyImportError("AC3D: Too many vertices, would run out of memory");
                }
                aiVector3D* vertices = mesh->mVertices = new aiVector3D[mesh->mNumVertices];
                unsigned int cur = 0;

                // allocate UV coordinates, but only if the texture name for the
                // surface is not empty
                aiVector3D* uv = NULL;
                if(object.texture.length())
                {
                    uv = mesh->mTextureCoords[0] = new aiVector3D[mesh->mNumVertices];
                    mesh->mNumUVComponents[0] = 2;
                }

                for (it = object.surfaces.begin(); it != end; ++it)
                {
                    if (mat == (*it).mat)
                    {
                        const Surface& src = *it;

                        // closed polygon
                        unsigned int type = (*it).flags & 0xf;
                        if (!type)
                        {
                            aiFace& face = *faces++;
                            if((face.mNumIndices = (unsigned int)src.entries.size()))
                            {
                                face.mIndices = new unsigned int[face.mNumIndices];
                                for (unsigned int i = 0; i < face.mNumIndices;++i,++vertices)
                                {
                                    const Surface::SurfaceEntry& entry = src.entries[i];
                                    face.mIndices[i] = cur++;

                                    // copy vertex positions
                                    if (static_cast<unsigned>(vertices - mesh->mVertices) >= mesh->mNumVertices) {
                                        throw DeadlyImportError("AC3D: Invalid number of vertices");
                                    }
                                    *vertices = object.vertices[entry.first] + object.translation;


                                    // copy texture coordinates
                                    if (uv)
                                    {
                                        uv->x =  entry.second.x;
                                        uv->y =  entry.second.y;
                                        ++uv;
                                    }
                                }
                            }
                        }
                        else
                        {

                            it2  = (*it).entries.begin();

                            // either a closed or an unclosed line
                            unsigned int tmp = (unsigned int)(*it).entries.size();
                            if (0x2 == type)--tmp;
                            for (unsigned int m = 0; m < tmp;++m)
                            {
                                aiFace& face = *faces++;

                                face.mNumIndices = 2;
                                face.mIndices = new unsigned int[2];
                                face.mIndices[0] = cur++;
                                face.mIndices[1] = cur++;

                                // copy vertex positions
                                if (it2 == (*it).entries.end() ) {
                                    throw DeadlyImportError("AC3D: Bad line");
                                }
                                ai_assert((*it2).first < object.vertices.size());
                                *vertices++ = object.vertices[(*it2).first];

                                // copy texture coordinates
                                if (uv)
                                {
                                    uv->x =  (*it2).second.x;
                                    uv->y =  (*it2).second.y;
                                    ++uv;
                                }


                                if (0x1 == type && tmp-1 == m)
                                {
                                    // if this is a closed line repeat its beginning now
                                    it2  = (*it).entries.begin();
                                }
                                else ++it2;

                                // second point
                                *vertices++ = object.vertices[(*it2).first];

                                if (uv)
                                {
                                    uv->x =  (*it2).second.x;
                                    uv->y =  (*it2).second.y;
                                    ++uv;
                                }
                            }
                        }
                    }
                }
            }

            // Now apply catmull clark subdivision if necessary. We split meshes into
            // materials which is not done by AC3D during smoothing, so we need to
            // collect all meshes using the same material group.
            if (object.subDiv)  {
                if (configEvalSubdivision) {
                    std::unique_ptr<Subdivider> div(Subdivider::Create(Subdivider::CATMULL_CLARKE));
                    ASSIMP_LOG_INFO("AC3D: Evaluating subdivision surface: "+object.name);

                    std::vector<aiMesh*> cpy(meshes.size()-oldm,NULL);
                    div->Subdivide(&meshes[oldm],cpy.size(),&cpy.front(),object.subDiv,true);
                    std::copy(cpy.begin(),cpy.end(),meshes.begin()+oldm);

                    // previous meshes are deleted vy Subdivide().
                }
                else {
                    ASSIMP_LOG_INFO("AC3D: Letting the subdivision surface untouched due to my configuration: "
                        +object.name);
                }
            }
        }
    }

    if (object.name.length())
        node->mName.Set(object.name);
    else
    {
        // generate a name depending on the type of the node
        switch (object.type)
        {
        case Object::Group:
            node->mName.length = ::ai_snprintf(node->mName.data, MAXLEN, "ACGroup_%i",groups++);
            break;
        case Object::Poly:
            node->mName.length = ::ai_snprintf(node->mName.data, MAXLEN, "ACPoly_%i",polys++);
            break;
        case Object::Light:
            node->mName.length = ::ai_snprintf(node->mName.data, MAXLEN, "ACLight_%i",lights++);
            break;

            // there shouldn't be more than one world, but we don't care
        case Object::World:
            node->mName.length = ::ai_snprintf(node->mName.data, MAXLEN, "ACWorld_%i",worlds++);
            break;
        }
    }


    // setup the local transformation matrix of the object
    // compute the transformation offset to the parent node
    node->mTransformation = aiMatrix4x4 ( object.rotation );

    if (object.type == Object::Group || !object.numRefs)
    {
        node->mTransformation.a4 = object.translation.x;
        node->mTransformation.b4 = object.translation.y;
        node->mTransformation.c4 = object.translation.z;
    }

    // add children to the object
    if (object.children.size())
    {
        node->mNumChildren = (unsigned int)object.children.size();
        node->mChildren = new aiNode*[node->mNumChildren];
        for (unsigned int i = 0; i < node->mNumChildren;++i)
        {
            node->mChildren[i] = ConvertObjectSection(object.children[i],meshes,outMaterials,materials,node);
        }
    }

    return node;
}